

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O3

void __thiscall
QDBusConnectionPrivate::disconnectRelay
          (QDBusConnectionPrivate *this,QString *service,QString *path,QString *interface,
          QDBusAbstractInterface *receiver,QMetaMethod *signal)

{
  int *piVar1;
  QDebug QVar2;
  bool bVar3;
  int minMIdx;
  char16_t *pcVar4;
  storage_type *psVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_1e0;
  undefined8 *local_1d8;
  bool result;
  undefined7 uStack_1c7;
  undefined8 *local_1c0;
  Latin1Content local_1b8;
  QDebug local_1b0;
  ArgMatchRules local_1a8;
  QString local_178;
  QByteArray local_158;
  QString local_138;
  SignalHook local_118;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_118.service.d.d = (Data *)0x0;
  local_118.service.d.ptr = (char16_t *)0x0;
  local_118.service.d.size = 0;
  local_118.path.d.d = (Data *)0x0;
  local_118.path.d.ptr = (char16_t *)0x0;
  local_118.path.d.size = 0;
  local_118.signature.d.d = (Data *)0x0;
  local_118.signature.d.ptr = (char16_t *)0x0;
  local_118.signature.d.size = 0;
  local_118.obj = (QObject *)0x0;
  local_118.midx = -1;
  local_118._84_4_ = 0xaaaaaaaa;
  local_118.params.d.d = (Data *)0x0;
  local_118.params.d.ptr = (QMetaType *)0x0;
  local_118.params.d.size = 0;
  local_118.argumentMatch.args.d.d = (Data *)0x0;
  local_118.argumentMatch.args.d.ptr = (QString *)0x0;
  local_118.argumentMatch.args.d.size = 0;
  local_118.argumentMatch.arg0namespace.d.d = (Data *)0x0;
  local_118.argumentMatch.arg0namespace.d.ptr = (char16_t *)0x0;
  local_118.argumentMatch.arg0namespace.d.size = 0;
  local_118.matchRule.d.d = (Data *)0x0;
  local_118.matchRule.d.ptr = (char *)0x0;
  local_118.matchRule.d.size = 0;
  local_138.d.size = 0;
  local_138.d.d = (Data *)0x0;
  local_138.d.ptr = (char16_t *)0x0;
  local_158.d.size = 0;
  local_158.d.d = (Data *)0x0;
  local_158.d.ptr = (char *)0x0;
  QByteArray::append((char)&local_158);
  QMetaMethod::methodSignature();
  QByteArray::append(&local_158);
  piVar1 = (int *)CONCAT44(local_1a8.args.d.d._4_4_,local_1a8.args.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_1a8.args.d.d._4_4_,local_1a8.args.d.d._0_4_),1,0x10);
    }
  }
  local_178.d.size = 0;
  local_178.d.d = (Data *)0x0;
  local_178.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_1a8.arg0namespace.d.ptr = (char16_t *)0x0;
  local_1a8.arg0namespace.d.size = 0;
  local_1a8.args.d.size._0_4_ = 0;
  local_1a8.args.d.size._4_4_ = 0;
  local_1a8.arg0namespace.d.d = (Data *)0x0;
  local_1a8.args.d.d._0_4_ = 0;
  local_1a8.args.d.d._4_4_ = 0;
  local_1a8.args.d.ptr._0_4_ = 0;
  local_1a8.args.d.ptr._4_4_ = 0;
  pcVar6 = local_158.d.ptr;
  if (local_158.d.ptr == (char *)0x0) {
    pcVar6 = (char *)&QByteArray::_empty;
  }
  minMIdx = QMetaObject::methodCount();
  bVar3 = prepareHook(&local_118,&local_138,service,path,interface,&local_58,&local_1a8,
                      (QObject *)receiver,pcVar6,minMIdx,true,&local_178);
  if (&(local_1a8.arg0namespace.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.arg0namespace.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.arg0namespace.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_1a8.arg0namespace.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_1a8.arg0namespace.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1a8);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar3) {
    local_1a8.args.d.size = (qsizetype)&result;
    result = false;
    local_58.d.d = (Data *)removeSignalHookImpl;
    local_58.d.ptr = (char16_t *)0x0;
    local_1a8.args.d.d._0_4_ = 0x1c39d0;
    local_1a8.args.d.d._4_4_ = 0;
    local_1a8.args.d.ptr._0_4_ = 0;
    local_1a8.args.d.ptr._4_4_ = 0;
    QMetaObject::
    invokeMethodCallableHelper<bool(QDBusConnectionPrivate::*)(QString_const&,QDBusConnectionPrivate::SignalHook_const&),QString_const&,QDBusConnectionPrivate::SignalHook_const&>
              (this,(offset_in_QDBusConnectionPrivate_to_subr *)&local_58,BlockingQueuedConnection,
               (QMetaMethodReturnArgument *)&local_1a8,&local_138,&local_118);
  }
  else {
    dbusIntegration();
    if (((byte)dbusIntegration::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
        0) {
      local_1a8.args.d.d._0_4_ = 2;
      local_1a8.args.d.d._4_4_ = 0;
      local_1a8.args.d.ptr._0_4_ = 0;
      local_1a8.args.d.ptr._4_4_ = 0;
      local_1a8.args.d.size._0_4_ = 0;
      local_1a8.args.d.size._4_4_ = 0;
      local_1a8.arg0namespace.d.d = (Data *)dbusIntegration::category.name;
      QMessageLogger::warning();
      QVar2.stream = local_1b0.stream;
      QVar7.m_data = (storage_type *)0x14;
      QVar7.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      pcVar4 = (interface->d).ptr;
      if (pcVar4 == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_1b0,(ulong)pcVar4);
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      QVar2.stream = local_1b0.stream;
      QVar8.m_data = (storage_type *)0x2;
      QVar8.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      QMetaMethod::methodSignature();
      if (local_1c0 == (undefined8 *)0x0) {
        local_1c0 = &QByteArray::_empty;
      }
      QDebug::putByteArray((char *)&local_1b0,(ulong)local_1c0,local_1b8);
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      QVar2.stream = local_1b0.stream;
      QVar9.m_data = (storage_type *)0x1;
      QVar9.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      QString::toLocal8Bit_helper((QChar *)&local_1e0,(longlong)local_178.d.ptr);
      QVar2.stream = local_1b0.stream;
      if (local_1d8 == (undefined8 *)0x0) {
        local_1d8 = &QByteArray::_empty;
      }
      psVar5 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar6 = psVar5 + (long)local_1d8 + 1;
        psVar5 = psVar5 + 1;
      } while (*pcVar6 != '\0');
      QVar10.m_data = psVar5;
      QVar10.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_1b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_1b0.stream,' ');
      }
      if (local_1e0 != (QArrayData *)0x0) {
        LOCK();
        (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_1e0,1,0x10);
        }
      }
      piVar1 = (int *)CONCAT71(uStack_1c7,result);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT71(uStack_1c7,result),1,0x10);
        }
      }
      QDebug::~QDebug(&local_1b0);
    }
  }
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
    }
  }
  SignalHook::~SignalHook(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusConnectionPrivate::disconnectRelay(const QString &service,
                                             const QString &path, const QString &interface,
                                             QDBusAbstractInterface *receiver,
                                             const QMetaMethod &signal)
{
    // this function is called by QDBusAbstractInterface when one of its signals is disconnected
    // we remove relay from D-Bus into it
    SignalHook hook;
    QString key;

    QByteArray sig;
    sig.append(QSIGNAL_CODE + '0');
    sig.append(signal.methodSignature());
    QString errorMsg;
    if (!prepareHook(hook, key, service, path, interface, QString(), ArgMatchRules(), receiver, sig,
                     QDBusAbstractInterface::staticMetaObject.methodCount(), true, errorMsg)) {
        qCWarning(dbusIntegration) << "Could not disconnect" << interface << "to"
                                   << signal.methodSignature() << ":" << qPrintable(errorMsg);
        return;                 // don't disconnect
    }

    Q_ASSERT(thread() != QThread::currentThread());
    removeSignalHook(key, hook);
}